

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginTabBar(char *str_id,ImGuiTabBarFlags flags)

{
  float fVar1;
  ImGuiWindow *this;
  ImGuiContext *pIVar2;
  ImGuiID key;
  undefined1 local_50 [8];
  ImRect tab_bar_bb;
  ImGuiTabBar *tab_bar;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTabBarFlags flags_local;
  char *str_id_local;
  
  pIVar2 = GImGui;
  this = GImGui->CurrentWindow;
  if ((this->SkipItems & 1U) == 0) {
    key = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    tab_bar_bb.Max = (ImVec2)ImPool<ImGuiTabBar>::GetOrAddByKey(&pIVar2->TabBars,key);
    fVar1 = (pIVar2->Style).FramePadding.y;
    ImRect::ImRect((ImRect *)local_50,(this->DC).CursorPos.x,(this->DC).CursorPos.y,
                   (this->WorkRect).Max.x,fVar1 + fVar1 + (this->DC).CursorPos.y + pIVar2->FontSize)
    ;
    *(ImGuiID *)((long)tab_bar_bb.Max + 0x14) = key;
    str_id_local._7_1_ =
         BeginTabBarEx((ImGuiTabBar *)tab_bar_bb.Max,(ImRect *)local_50,flags | 0x200000,
                       (ImGuiDockNode *)0x0);
  }
  else {
    str_id_local._7_1_ = false;
  }
  return str_id_local._7_1_;
}

Assistant:

bool    ImGui::BeginTabBar(const char* str_id, ImGuiTabBarFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    ImGuiID id = window->GetID(str_id);
    ImGuiTabBar* tab_bar = g.TabBars.GetOrAddByKey(id);
    ImRect tab_bar_bb = ImRect(window->DC.CursorPos.x, window->DC.CursorPos.y, window->WorkRect.Max.x, window->DC.CursorPos.y + g.FontSize + g.Style.FramePadding.y * 2);
    tab_bar->ID = id;
    return BeginTabBarEx(tab_bar, tab_bar_bb, flags | ImGuiTabBarFlags_IsFocused, NULL);
}